

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  Mat *this_00;
  uint uVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  Layer *pLVar8;
  undefined4 *puVar9;
  int _w;
  undefined4 *puVar10;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  ParamDict pd;
  Mat local_78;
  
  pLVar8 = create_layer(0xe);
  this->flatten = pLVar8;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    p_Var3 = this->_vptr_InnerProduct_x86[-3];
    uVar1 = *(uint *)(p_Var3 + 0x28 + (long)&(this->weight_data_int8).data);
    uVar7 = (long)*(int *)(p_Var3 + 0x30 + (long)&(this->weight_data_int8).data) / (long)(int)uVar1;
    if (((uVar1 & 3) == 0 & opt->use_packing_layout) == 1) {
      this_00 = (Mat *)(this->_vptr_InnerProduct_x86[-3] + 0x40 + (long)&(this->scales_in).data);
      _w = (int)uVar7;
      Mat::reshape(&local_78,this_00,_w,this_00[-2].h,(Allocator *)0x0);
      Mat::create(&this->weight_data_packed,_w,
                  *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                          (long)&(this->weight_data_int8).data) / 4,0x10,4,(Allocator *)0x0);
      pp_Var4 = this->_vptr_InnerProduct_x86;
      if (3 < *(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data)) {
        pvVar5 = (this->weight_data_packed).data;
        iVar2 = (this->weight_data_packed).w;
        sVar6 = (this->weight_data_packed).elemsize;
        puVar10 = (undefined4 *)local_78.data;
        uVar13 = 0;
        do {
          if (0 < _w) {
            puVar14 = (undefined4 *)
                      ((uVar13 >> 2 & 0x3fffffff) * (long)iVar2 * sVar6 + (long)pvVar5);
            uVar15 = 0;
            puVar9 = puVar10;
            lVar12 = 4;
            puVar11 = puVar10;
            do {
              do {
                *puVar14 = *puVar9;
                puVar14 = puVar14 + 1;
                lVar12 = lVar12 + -1;
                puVar9 = (undefined4 *)((long)puVar9 + (long)local_78.w * local_78.elemsize);
              } while (lVar12 != 0);
              uVar15 = uVar15 + 1;
              puVar9 = puVar11 + 1;
              lVar12 = 4;
              puVar11 = puVar9;
            } while (uVar15 != (uVar7 & 0xffffffff));
          }
          lVar12 = uVar13 + 7;
          puVar10 = puVar10 + (long)local_78.w * local_78.elemsize;
          uVar13 = uVar13 + 4;
        } while (lVar12 < *(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data));
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}